

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeUnsignedLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  uVar1 = MCInst_getOpcode(Inst);
  if (0x499 < (int)uVar1) {
    if ((int)uVar1 < 0x76d) {
      if ((int)uVar1 < 0x75e) {
        if (uVar1 == 0x49a) {
          MCOperand_CreateImm0(Inst,(ulong)(insn & 0x1f));
          goto LAB_0016e1d5;
        }
        if (uVar1 != 0x759) {
          return MCDisassembler_Fail;
        }
      }
      else {
        if (uVar1 == 0x75e) goto LAB_0016e14a;
        if (uVar1 == 0x763) goto LAB_0016e1a0;
        if (uVar1 != 0x768) {
          return MCDisassembler_Fail;
        }
      }
    }
    else {
      if ((int)uVar1 < 0x777) {
        if (uVar1 == 0x76d) goto LAB_0016e234;
        if (uVar1 != 0x772) {
          return MCDisassembler_Fail;
        }
        goto LAB_0016e228;
      }
      if (uVar1 == 0x777) {
LAB_0016e240:
        puVar3 = FPR32DecoderTable;
        goto LAB_0016e1ca;
      }
      if (uVar1 != 0x77c) {
        if (uVar1 != 0x781) {
          return MCDisassembler_Fail;
        }
        goto LAB_0016e182;
      }
    }
    goto LAB_0016e1c0;
  }
  if ((int)uVar1 < 0x3dd) {
    if ((int)uVar1 < 0x3d3) {
      if (uVar1 == 0x3c8) {
LAB_0016e1c0:
        puVar3 = GPR32DecoderTable;
      }
      else {
        if (uVar1 != 0x3cd) {
          return MCDisassembler_Fail;
        }
LAB_0016e14a:
        puVar3 = FPR8DecoderTable;
      }
    }
    else {
      if (uVar1 != 0x3d3) {
        if (uVar1 != 0x3d8) {
          return MCDisassembler_Fail;
        }
        goto LAB_0016e1c0;
      }
LAB_0016e1a0:
      puVar3 = FPR64DecoderTable;
    }
  }
  else {
    uVar4 = (ulong)(uVar1 - 1000);
    if (uVar1 - 1000 < 0x28) {
      if ((0x8000208020U >> (uVar4 & 0x3f) & 1) != 0) {
LAB_0016e182:
        puVar3 = GPR64DecoderTable;
        goto LAB_0016e1ca;
      }
      if ((0x200000401U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0016e1c0;
      if (uVar4 == 0x1b) goto LAB_0016e240;
    }
    if (uVar1 == 0x3dd) {
LAB_0016e234:
      puVar3 = FPR16DecoderTable;
    }
    else {
      if (uVar1 != 0x3e3) {
        return MCDisassembler_Fail;
      }
LAB_0016e228:
      puVar3 = FPR128DecoderTable;
    }
  }
LAB_0016e1ca:
  MCOperand_CreateReg0(Inst,puVar3[insn & 0x1f]);
LAB_0016e1d5:
  uVar2 = insn >> 5 & 0x1f;
  uVar1 = 4;
  if (uVar2 != 0x1f) {
    uVar1 = GPR64DecoderTable[uVar2];
  }
  MCOperand_CreateReg0(Inst,uVar1);
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 10 & 0xfff));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeUnsignedLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned offset = fieldFromInstruction(insn, 10, 12);

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_PRFMui:
			// Rt is an immediate in prefetch.
			MCOperand_CreateImm0(Inst, Rt);
			break;
		case AArch64_STRBBui:
		case AArch64_LDRBBui:
		case AArch64_LDRSBWui:
		case AArch64_STRHHui:
		case AArch64_LDRHHui:
		case AArch64_LDRSHWui:
		case AArch64_STRWui:
		case AArch64_LDRWui:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRSBXui:
		case AArch64_LDRSHXui:
		case AArch64_LDRSWui:
		case AArch64_STRXui:
		case AArch64_LDRXui:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRQui:
		case AArch64_STRQui:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRDui:
		case AArch64_STRDui:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRSui:
		case AArch64_STRSui:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRHui:
		case AArch64_STRHui:
			DecodeFPR16RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRBui:
		case AArch64_STRBui:
			DecodeFPR8RegisterClass(Inst, Rt, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	//if (!Dis->tryAddingSymbolicOperand(Inst, offset, Addr, Fail, 0, 4))
	MCOperand_CreateImm0(Inst, offset);

	return Success;
}